

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O1

void tick_prog_academy_reset(AREA_DATA_conflict *area)

{
  undefined2 uVar1;
  CHAR_DATA **ppCVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *ch;
  char buf [4608];
  char local_1238 [4616];
  
  ch = char_list;
  if (char_list != (CHAR_DATA *)0x0) {
    do {
      bVar3 = is_npc(ch);
      if ((((!bVar3) && (ch->in_room->area == area)) && (10 < ch->level)) &&
         ((ch->fighting == (CHAR_DATA *)0x0 && (bVar3 = is_immortal(ch), !bVar3)))) {
        send_to_char("A small contingent of guards rapidly marches up to you.\n\r",ch);
        act("A small contingent of guards rapidly marches up to $n, marching $m off.",ch,(void *)0x0
            ,(void *)0x0,0);
        pcVar5 = get_char_color(ch,"speech");
        pcVar6 = END_COLOR(ch);
        sprintf(local_1238,
                "A Royal Academy Guard says \'%sBy the orders of the King, you have completed your training and must depart.%s\'\n\r"
                ,pcVar5,pcVar6);
        send_to_char(local_1238,ch);
        send_to_char("The guards lead you to the exit of the Academy.\n\r",ch);
        do_look(ch,"auto");
        pcVar5 = get_char_color(ch,"speech");
        pcVar6 = END_COLOR(ch);
        sprintf(local_1238,
                "A Royal Academy Guard says \'%sThe King allows a small reward for the completion of your training here.%s\'\n\r"
                ,pcVar5,pcVar6);
        send_to_char(local_1238,ch);
        send_to_char("A Royal Academy Guard gives you 25 gold.\n\r",ch);
        ch->gold = ch->gold + 0x19;
        char_from_room(ch);
        pRoomIndex = get_room_index(0);
        char_to_room(ch,pRoomIndex);
        pcVar5 = get_char_color(ch,"speech");
        is_good(ch);
        END_COLOR(ch);
        sprintf(local_1238,
                "A Royal Academy Guard says \'%sA tip from me: if you\'re looking to learn further, I might try %s.%s\'\n\r"
                ,pcVar5);
        send_to_char(local_1238,ch);
      }
      ppCVar2 = &ch->next;
      ch = *ppCVar2;
    } while (*ppCVar2 != (CHAR_DATA *)0x0);
  }
  uVar1 = area->age;
  if ((((ushort)(uVar1 - 3) < 3) && (iVar4 = number_percent(), 0x32 < iVar4)) || (5 < area->age)) {
    reset_area(area);
  }
  return;
}

Assistant:

void tick_prog_academy_reset(AREA_DATA *area)
{
	CHAR_DATA *ch;

	for (ch = char_list; ch; ch = ch->next)
	{
		if (!is_npc(ch) && ch->in_room->area == area && ch->level > 10 && !ch->fighting && !is_immortal(ch))
		{
			char buf[MSL];

			send_to_char("A small contingent of guards rapidly marches up to you.\n\r", ch);
			act("A small contingent of guards rapidly marches up to $n, marching $m off.", ch, 0, 0, TO_ROOM);

			sprintf(buf, "A Royal Academy Guard says '%sBy the orders of the King, you have completed your training and must depart.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("The guards lead you to the exit of the Academy.\n\r", ch);

			do_look(ch, "auto");
			sprintf(buf, "A Royal Academy Guard says '%sThe King allows a small reward for the completion of your training here.%s'\n\r",
				get_char_color(ch, "speech"),
				END_COLOR(ch));
			send_to_char(buf, ch);
			send_to_char("A Royal Academy Guard gives you 25 gold.\n\r", ch);

			ch->gold += 25;

			char_from_room(ch);
			char_to_room(ch, get_room_index(ROOM_VNUM_TEMPLE));

			sprintf(buf, "A Royal Academy Guard says '%sA tip from me: if you're looking to learn further, I might try %s.%s'\n\r",
				get_char_color(ch, "speech"),
				is_good(ch)
					? "the parrots in the forest off of the road south of Cimar or the trolls in the forests off the Great Shalaran Road"
					: "the parrots in the forest off of the road south of Cimar or the pixies in the Emerald Forest off the Melcene Plains Road",
				END_COLOR(ch));
			send_to_char(buf, ch);
		}
	}

	if (area->age > 2 && area->age < 6)
	{
		if (number_percent() > 50)
		{
			reset_area(area);
			return;
		}
	}

	if (area->age >= 6)
		reset_area(area);

	/*
	for ( ch->level = ch->level ; ch->level < 25; ch->level++ )
	{
		advance_level( ch,false);
	}
	ch->exp = exp_per_level(ch) * (ch->level - 1);
	*/
}